

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall olc::PixelGameEngine::olc_UpdateMouse(PixelGameEngine *this,int32_t x,int32_t y)

{
  int iVar1;
  int iVar2;
  vi2d vVar3;
  int iVar4;
  int iVar5;
  
  this->bHasMouseFocus = true;
  vVar3.y = y;
  vVar3.x = x;
  this->vMouseWindowPos = vVar3;
  iVar1 = (this->vViewPos).x;
  iVar4 = (this->vViewPos).y;
  iVar2 = (this->vScreenSize).x;
  iVar5 = (int)((float)iVar2 * ((float)(x - iVar1) / (float)((this->vWindowSize).x + iVar1 * -2)));
  iVar1 = (this->vScreenSize).y;
  (this->vMousePosCache).x = iVar5;
  iVar4 = (int)((float)iVar1 * ((float)(y - iVar4) / (float)((this->vWindowSize).y + iVar4 * -2)));
  (this->vMousePosCache).y = iVar4;
  if (iVar2 <= iVar5) {
    (this->vMousePosCache).x = iVar2 + -1;
  }
  if (iVar1 <= iVar4) {
    (this->vMousePosCache).y = iVar1 + -1;
  }
  if ((this->vMousePosCache).x < 0) {
    (this->vMousePosCache).x = 0;
  }
  if (-1 < (this->vMousePosCache).y) {
    return;
  }
  (this->vMousePosCache).y = 0;
  return;
}

Assistant:

void PixelGameEngine::olc_UpdateMouse(int32_t x, int32_t y)
	{
		// Mouse coords come in screen space
		// But leave in pixel space
		bHasMouseFocus = true;
		vMouseWindowPos = { x, y };
		// Full Screen mode may have a weird viewport we must clamp to
		x -= vViewPos.x;
		y -= vViewPos.y;
		vMousePosCache.x = (int32_t)(((float)x / (float)(vWindowSize.x - (vViewPos.x * 2)) * (float)vScreenSize.x));
		vMousePosCache.y = (int32_t)(((float)y / (float)(vWindowSize.y - (vViewPos.y * 2)) * (float)vScreenSize.y));
		if (vMousePosCache.x >= (int32_t)vScreenSize.x)	vMousePosCache.x = vScreenSize.x - 1;
		if (vMousePosCache.y >= (int32_t)vScreenSize.y)	vMousePosCache.y = vScreenSize.y - 1;
		if (vMousePosCache.x < 0) vMousePosCache.x = 0;
		if (vMousePosCache.y < 0) vMousePosCache.y = 0;
	}